

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

xmlChar * xmlDictAddQString(xmlDictPtr dict,xmlChar *prefix,uint plen,xmlChar *name,uint namelen)

{
  undefined1 *puVar1;
  ulong local_58;
  size_t limit;
  size_t size;
  xmlChar *ret;
  xmlDictStringsPtr_conflict pool;
  uint namelen_local;
  xmlChar *name_local;
  uint plen_local;
  xmlChar *prefix_local;
  xmlDictPtr dict_local;
  
  limit = 0;
  local_58 = 0;
  for (ret = (xmlChar *)dict->strings; ret != (xmlChar *)0x0; ret = *(xmlChar **)ret) {
    if ((ulong)(namelen + plen + 1) < (ulong)(*(long *)(ret + 0x10) - *(long *)(ret + 8)))
    goto LAB_0012e569;
    if (limit < *(ulong *)(ret + 0x18)) {
      limit = *(size_t *)(ret + 0x18);
    }
    local_58 = *(long *)(ret + 0x18) + local_58;
  }
  if ((dict->limit == 0) || (local_58 <= dict->limit)) {
    if (limit == 0) {
      limit = 1000;
    }
    else {
      limit = limit << 2;
    }
    if (limit < (namelen + plen + 1) * 4) {
      limit = (size_t)((namelen + plen + 1) * 4);
    }
    ret = (xmlChar *)(*xmlMalloc)(limit + 0x30);
    if ((xmlDictStringsPtr_conflict)ret == (xmlDictStringsPtr_conflict)0x0) {
      dict_local = (xmlDictPtr)0x0;
    }
    else {
      ((xmlDictStringsPtr_conflict)ret)->size = limit;
      ((xmlDictStringsPtr_conflict)ret)->nbStrings = 0;
      ((xmlDictStringsPtr_conflict)ret)->free = ((xmlDictStringsPtr_conflict)ret)->array;
      ((xmlDictStringsPtr_conflict)ret)->end = ((xmlDictStringsPtr_conflict)ret)->array + limit;
      ((xmlDictStringsPtr_conflict)ret)->next = dict->strings;
      dict->strings = (xmlDictStringsPtr_conflict)ret;
LAB_0012e569:
      dict_local = *(xmlDictPtr *)(ret + 8);
      memcpy(*(void **)(ret + 8),prefix,(ulong)plen);
      *(ulong *)(ret + 8) = *(long *)(ret + 8) + (ulong)plen;
      puVar1 = *(undefined1 **)(ret + 8);
      *(undefined1 **)(ret + 8) = puVar1 + 1;
      *puVar1 = 0x3a;
      memcpy(*(void **)(ret + 8),name,(ulong)namelen);
      *(ulong *)(ret + 8) = *(long *)(ret + 8) + (ulong)namelen;
      puVar1 = *(undefined1 **)(ret + 8);
      *(undefined1 **)(ret + 8) = puVar1 + 1;
      *puVar1 = 0;
      *(long *)(ret + 0x20) = *(long *)(ret + 0x20) + 1;
    }
  }
  else {
    dict_local = (xmlDictPtr)0x0;
  }
  return (xmlChar *)dict_local;
}

Assistant:

static const xmlChar *
xmlDictAddQString(xmlDictPtr dict, const xmlChar *prefix, unsigned int plen,
                 const xmlChar *name, unsigned int namelen)
{
    xmlDictStringsPtr pool;
    const xmlChar *ret;
    size_t size = 0; /* + sizeof(_xmlDictStrings) == 1024 */
    size_t limit = 0;

    pool = dict->strings;
    while (pool != NULL) {
	if ((size_t)(pool->end - pool->free) > namelen + plen + 1)
	    goto found_pool;
	if (pool->size > size) size = pool->size;
        limit += pool->size;
	pool = pool->next;
    }
    /*
     * Not found, need to allocate
     */
    if (pool == NULL) {
        if ((dict->limit > 0) && (limit > dict->limit)) {
            return(NULL);
        }

        if (size == 0) size = 1000;
	else size *= 4; /* exponential growth */
        if (size < 4 * (namelen + plen + 1))
	    size = 4 * (namelen + plen + 1); /* just in case ! */
	pool = (xmlDictStringsPtr) xmlMalloc(sizeof(xmlDictStrings) + size);
	if (pool == NULL)
	    return(NULL);
	pool->size = size;
	pool->nbStrings = 0;
	pool->free = &pool->array[0];
	pool->end = &pool->array[size];
	pool->next = dict->strings;
	dict->strings = pool;
    }
found_pool:
    ret = pool->free;
    memcpy(pool->free, prefix, plen);
    pool->free += plen;
    *(pool->free++) = ':';
    memcpy(pool->free, name, namelen);
    pool->free += namelen;
    *(pool->free++) = 0;
    pool->nbStrings++;
    return(ret);
}